

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SigmoidKernel::SerializeWithCachedSizes
          (SigmoidKernel *this,CodedOutputStream *output)

{
  double dVar1;
  
  dVar1 = this->gamma_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    google::protobuf::internal::WireFormatLite::WriteDouble(1,dVar1,output);
  }
  dVar1 = this->c_;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteDouble(2,dVar1,output);
  return;
}

Assistant:

void SigmoidKernel::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SigmoidKernel)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // double gamma = 1;
  if (this->gamma() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(1, this->gamma(), output);
  }

  // double c = 2;
  if (this->c() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(2, this->c(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SigmoidKernel)
}